

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  byte *in_RDI;
  int i;
  uint3 in_stack_fffffffffffffff0;
  uint uVar1;
  int iVar2;
  
  uVar1 = (uint)in_stack_fffffffffffffff0;
  if ((*in_RDI & 1) == 0) {
    uVar1 = CONCAT13(1,in_stack_fffffffffffffff0);
  }
  if ((char)(uVar1 >> 0x18) == '\0') {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x727,"void ImFontAtlas::ClearFonts()");
  }
  for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x40); iVar2 = iVar2 + 1) {
    ImVector<ImFont_*>::operator[]
              ((ImVector<ImFont_*> *)CONCAT44(iVar2,uVar1),(int)((ulong)in_RDI >> 0x20));
    IM_DELETE<ImFont>((ImFont *)0x221f2e);
  }
  ImVector<ImFont_*>::clear((ImVector<ImFont_*> *)CONCAT44(iVar2,uVar1));
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < Fonts.Size; i++)
        IM_DELETE(Fonts[i]);
    Fonts.clear();
}